

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

__m128i filter_block_2rows(__m128i *a0,__m128i *b0,__m128i *a1,__m128i *b1,__m128i *filter)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 (*in_R8) [16];
  __m128i alVar5;
  __m128i v_val_w;
  __m128i v_val_w_00;
  __m128i v1;
  __m128i v0;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  local_78 = (undefined1)uVar1;
  uStack_77 = (undefined1)((ulong)uVar1 >> 8);
  uStack_76 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_75 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_74 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_73 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_72 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_71 = (undefined1)((ulong)uVar1 >> 0x38);
  local_88 = (undefined1)uVar2;
  uStack_87 = (undefined1)((ulong)uVar2 >> 8);
  uStack_86 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_85 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_84 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_83 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_82 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_81 = (undefined1)((ulong)uVar2 >> 0x38);
  local_e8._0_2_ = CONCAT11(local_88,local_78);
  local_e8._0_3_ = CONCAT12(uStack_77,(undefined2)local_e8);
  local_e8._0_4_ = CONCAT13(uStack_87,(undefined3)local_e8);
  local_e8._0_5_ = CONCAT14(uStack_76,(undefined4)local_e8);
  local_e8._0_6_ = CONCAT15(uStack_86,(undefined5)local_e8);
  local_e8._0_7_ = CONCAT16(uStack_75,(undefined6)local_e8);
  local_e8 = CONCAT17(uStack_85,(undefined7)local_e8);
  uStack_e0._0_1_ = uStack_74;
  uStack_e0._1_1_ = uStack_84;
  uStack_e0._2_1_ = uStack_73;
  uStack_e0._3_1_ = uStack_83;
  uStack_e0._4_1_ = uStack_72;
  uStack_e0._5_1_ = uStack_82;
  uStack_e0._6_1_ = uStack_71;
  uStack_e0._7_1_ = uStack_81;
  auVar4._8_8_ = uStack_e0;
  auVar4._0_8_ = local_e8;
  pmaddubsw(auVar4,*in_R8);
  v_val_w[1] = (longlong)in_RSI;
  v_val_w[0] = 7;
  alVar5 = xx_roundn_epu16(v_val_w,(int)in_RDX);
  uVar1 = *in_RDX;
  uVar2 = *in_RCX;
  local_98 = (undefined1)uVar1;
  uStack_97 = (undefined1)((ulong)uVar1 >> 8);
  uStack_96 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_95 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_94 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_93 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_92 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_91 = (undefined1)((ulong)uVar1 >> 0x38);
  local_a8 = (undefined1)uVar2;
  uStack_a7 = (undefined1)((ulong)uVar2 >> 8);
  uStack_a6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_a5 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_a4 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_a3 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_a2 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_a1 = (undefined1)((ulong)uVar2 >> 0x38);
  local_f8._0_2_ = CONCAT11(local_a8,local_98);
  local_f8._0_3_ = CONCAT12(uStack_97,(undefined2)local_f8);
  local_f8._0_4_ = CONCAT13(uStack_a7,(undefined3)local_f8);
  local_f8._0_5_ = CONCAT14(uStack_96,(undefined4)local_f8);
  local_f8._0_6_ = CONCAT15(uStack_a6,(undefined5)local_f8);
  local_f8._0_7_ = CONCAT16(uStack_95,(undefined6)local_f8);
  local_f8 = CONCAT17(uStack_a5,(undefined7)local_f8);
  uStack_f0._0_1_ = uStack_94;
  uStack_f0._1_1_ = uStack_a4;
  uStack_f0._2_1_ = uStack_93;
  uStack_f0._3_1_ = uStack_a3;
  uStack_f0._4_1_ = uStack_92;
  uStack_f0._5_1_ = uStack_a2;
  uStack_f0._6_1_ = uStack_91;
  uStack_f0._7_1_ = uStack_a1;
  auVar3._8_8_ = uStack_f0;
  auVar3._0_8_ = local_f8;
  pmaddubsw(auVar3,*in_R8);
  v_val_w_00[1] = (longlong)in_RSI;
  v_val_w_00[0] = 7;
  alVar5 = xx_roundn_epu16(v_val_w_00,(int)alVar5[1]);
  alVar5[0] = alVar5[0];
  alVar5[1] = alVar5[1];
  return alVar5;
}

Assistant:

static inline __m128i filter_block_2rows(const __m128i *a0, const __m128i *b0,
                                         const __m128i *a1, const __m128i *b1,
                                         const __m128i *filter) {
  __m128i v0 = _mm_unpacklo_epi8(*a0, *b0);
  v0 = _mm_maddubs_epi16(v0, *filter);
  v0 = xx_roundn_epu16(v0, FILTER_BITS);

  __m128i v1 = _mm_unpacklo_epi8(*a1, *b1);
  v1 = _mm_maddubs_epi16(v1, *filter);
  v1 = xx_roundn_epu16(v1, FILTER_BITS);

  return _mm_packus_epi16(v0, v1);
}